

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFAGenerateCountedTransition
               (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to,int counter)

{
  if (to == (xmlRegStatePtr)0x0) {
    to = xmlRegNewState(ctxt);
    xmlRegStatePush(ctxt,to);
    ctxt->state = to;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,to,-1,counter);
  return;
}

Assistant:

static void
xmlFAGenerateCountedTransition(xmlRegParserCtxtPtr ctxt,
	    xmlRegStatePtr from, xmlRegStatePtr to, int counter) {
    if (to == NULL) {
	to = xmlRegNewState(ctxt);
	xmlRegStatePush(ctxt, to);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, -1, counter);
}